

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence_helpers.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::LoopDependenceAnalysis::IsProvablyOutsideOfLoopBounds
          (LoopDependenceAnalysis *this,Loop *loop,SENode *distance,SENode *coefficient)

{
  ScalarEvolutionAnalysis *this_00;
  int iVar1;
  undefined4 extraout_var;
  SENode *pSVar2;
  SENode *pSVar3;
  long lVar4;
  SENode *operand_2;
  char *__s;
  string *debug_msg;
  string local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  undefined4 extraout_var_00;
  
  iVar1 = (*coefficient->_vptr_SENode[4])(coefficient);
  if (CONCAT44(extraout_var,iVar1) == 0) {
    __s = 
    "IsProvablyOutsideOfLoopBounds could not reduce coefficient to a SEConstantNode so must exit.";
    debug_msg = &local_50;
  }
  else {
    pSVar2 = GetLowerBound(this,loop);
    pSVar3 = GetUpperBound(this,loop);
    if (pSVar2 != (SENode *)0x0 && pSVar3 != (SENode *)0x0) {
      this_00 = &this->scalar_evolution_;
      if (*(long *)(CONCAT44(extraout_var,iVar1) + 0x30) < 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b0,
                   "IsProvablyOutsideOfLoopBounds found coefficient < 0.\nUsing bounds as lower - upper."
                   ,(allocator<char> *)&local_110);
        PrintDebug(this,&local_b0);
        std::__cxx11::string::_M_dispose();
        operand_2 = pSVar3;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_90,
                   "IsProvablyOutsideOfLoopBounds found coefficient >= 0.\nUsing bounds as upper - lower."
                   ,(allocator<char> *)&local_110);
        PrintDebug(this,&local_90);
        std::__cxx11::string::_M_dispose();
        operand_2 = pSVar2;
        pSVar2 = pSVar3;
      }
      pSVar2 = ScalarEvolutionAnalysis::CreateSubtraction(this_00,pSVar2,operand_2);
      pSVar2 = ScalarEvolutionAnalysis::SimplifyExpression(this_00,pSVar2);
      pSVar2 = ScalarEvolutionAnalysis::CreateSubtraction(this_00,distance,pSVar2);
      pSVar2 = ScalarEvolutionAnalysis::SimplifyExpression(this_00,pSVar2);
      iVar1 = (*pSVar2->_vptr_SENode[4])(pSVar2);
      lVar4 = CONCAT44(extraout_var_00,iVar1);
      if (lVar4 == 0) {
        return false;
      }
      ToString<long>(&local_110,this,*(long *)(lVar4 + 0x30));
      std::operator+(&local_d0,
                     "IsProvablyOutsideOfLoopBounds found distance - bounds as a SEConstantNode with value "
                     ,&local_110);
      PrintDebug(this,&local_d0);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      if (*(long *)(lVar4 + 0x30) < 1) {
        return false;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,
                 "IsProvablyOutsideOfLoopBounds found distance escaped the loop bounds.",
                 (allocator<char> *)&local_110);
      PrintDebug(this,&local_f0);
      std::__cxx11::string::_M_dispose();
      return true;
    }
    __s = 
    "IsProvablyOutsideOfLoopBounds could not get both the lower and upper bounds so must exit.";
    debug_msg = &local_70;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)debug_msg,__s,(allocator<char> *)&local_110);
  PrintDebug(this,debug_msg);
  std::__cxx11::string::_M_dispose();
  return false;
}

Assistant:

bool LoopDependenceAnalysis::IsProvablyOutsideOfLoopBounds(
    const Loop* loop, SENode* distance, SENode* coefficient) {
  // We test to see if we can reduce the coefficient to an integral constant.
  SEConstantNode* coefficient_constant = coefficient->AsSEConstantNode();
  if (!coefficient_constant) {
    PrintDebug(
        "IsProvablyOutsideOfLoopBounds could not reduce coefficient to a "
        "SEConstantNode so must exit.");
    return false;
  }

  SENode* lower_bound = GetLowerBound(loop);
  SENode* upper_bound = GetUpperBound(loop);
  if (!lower_bound || !upper_bound) {
    PrintDebug(
        "IsProvablyOutsideOfLoopBounds could not get both the lower and upper "
        "bounds so must exit.");
    return false;
  }
  // If the coefficient is positive we calculate bounds as upper - lower
  // If the coefficient is negative we calculate bounds as lower - upper
  SENode* bounds = nullptr;
  if (coefficient_constant->FoldToSingleValue() >= 0) {
    PrintDebug(
        "IsProvablyOutsideOfLoopBounds found coefficient >= 0.\n"
        "Using bounds as upper - lower.");
    bounds = scalar_evolution_.SimplifyExpression(
        scalar_evolution_.CreateSubtraction(upper_bound, lower_bound));
  } else {
    PrintDebug(
        "IsProvablyOutsideOfLoopBounds found coefficient < 0.\n"
        "Using bounds as lower - upper.");
    bounds = scalar_evolution_.SimplifyExpression(
        scalar_evolution_.CreateSubtraction(lower_bound, upper_bound));
  }

  // We can attempt to deal with symbolic cases by subtracting |distance| and
  // the bound nodes. If we can subtract, simplify and produce a SEConstantNode
  // we can produce some information.
  SEConstantNode* distance_minus_bounds =
      scalar_evolution_
          .SimplifyExpression(
              scalar_evolution_.CreateSubtraction(distance, bounds))
          ->AsSEConstantNode();
  if (distance_minus_bounds) {
    PrintDebug(
        "IsProvablyOutsideOfLoopBounds found distance - bounds as a "
        "SEConstantNode with value " +
        ToString(distance_minus_bounds->FoldToSingleValue()));
    // If distance - bounds > 0 we prove the distance is outwith the loop
    // bounds.
    if (distance_minus_bounds->FoldToSingleValue() > 0) {
      PrintDebug(
          "IsProvablyOutsideOfLoopBounds found distance escaped the loop "
          "bounds.");
      return true;
    }
  }

  return false;
}